

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

char * qpdf_get_info_key(qpdf_data qpdf,char *key)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  string local_120;
  allocator<char> local_f9;
  string local_f8 [32];
  undefined1 local_d8 [8];
  QPDFObjectHandle value;
  string local_c0;
  allocator<char> local_99;
  string local_98 [32];
  undefined1 local_78 [8];
  QPDFObjectHandle info;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  QPDFObjectHandle trailer;
  char *result;
  char *key_local;
  qpdf_data qpdf_local;
  
  trailer.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)qpdf);
  QPDF::getTrailer((QPDF *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"/Info",&local_51);
  bVar2 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_98,"/Info",&local_99);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_78,(string *)local_30);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator(&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,key,
               (allocator<char> *)
               ((long)&value.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    bVar2 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_78,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&value.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_f8,key,&local_f9);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_d8,(string *)local_78);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator(&local_f9);
      bVar2 = QPDFObjectHandle::isString((QPDFObjectHandle *)local_d8);
      if (bVar2) {
        QPDFObjectHandle::getStringValue_abi_cxx11_(&local_120,(QPDFObjectHandle *)local_d8);
        std::__cxx11::string::operator=((string *)&qpdf->tmp_string,(string *)&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        trailer.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::__cxx11::string::c_str();
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d8);
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_78);
  }
  QTC::TC("qpdf","qpdf-c get_info_key",
          (uint)(trailer.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0));
  _Var1 = trailer.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
  return (char *)_Var1._M_pi;
}

Assistant:

char const*
qpdf_get_info_key(qpdf_data qpdf, char const* key)
{
    char const* result = nullptr;
    QPDFObjectHandle trailer = qpdf->qpdf->getTrailer();
    if (trailer.hasKey("/Info")) {
        QPDFObjectHandle info = trailer.getKey("/Info");
        if (info.hasKey(key)) {
            QPDFObjectHandle value = info.getKey(key);
            if (value.isString()) {
                qpdf->tmp_string = value.getStringValue();
                result = qpdf->tmp_string.c_str();
            }
        }
    }
    QTC::TC("qpdf", "qpdf-c get_info_key", (result == nullptr ? 0 : 1));
    return result;
}